

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O1

void __thiscall QDebug::putByteArray(QDebug *this,char *begin,size_t length,Latin1Content content)

{
  byte bVar1;
  QTextStreamPrivate *this_00;
  QString *this_01;
  ulong extraout_RAX;
  undefined4 in_register_0000000c;
  storage_type *__n;
  uint uVar2;
  void *__buf;
  uchar *p;
  int __fd;
  long in_FS_OFFSET;
  bool bVar3;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  QChar quotes [2];
  QDebugStateSaver local_68;
  undefined2 local_5a;
  QString local_58;
  long local_38;
  
  __n = (storage_type *)CONCAT44(in_register_0000000c,content);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->stream->noQuotes == true) {
    this_01 = (QString *)0x0;
    if (0 < (long)length) {
      this_01 = (QString *)length;
    }
    bVar3 = begin == (char *)0x0;
    if (bVar3) {
      this_01 = (QString *)0x0;
    }
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    if (content == ContainsLatin1) {
      if (!bVar3 && (long)length < 0) {
        this_01 = (QString *)strlen(begin);
      }
      ba.m_data = __n;
      ba.m_size = (qsizetype)begin;
      QString::fromLatin1(&local_58,this_01,ba);
    }
    else {
      if (!bVar3 && (long)length < 0) {
        this_01 = (QString *)strlen(begin);
      }
      ba_00.m_data = __n;
      ba_00.m_size = (qsizetype)begin;
      QString::fromUtf8(&local_58,this_01,ba_00);
    }
    QTextStreamPrivate::putString
              ((this->stream->ts).d_ptr._M_t.
               super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
               _M_t.
               super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
               .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl,
               (QChar *)local_58.d.ptr,local_58.d.size,false);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    local_68.d._M_t.
    super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>.
    _M_t.
    super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>
    .super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
         (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
         &DAT_aaaaaaaaaaaaaaaa;
    QDebugStateSaver::QDebugStateSaver(&local_68,this);
    QTextStreamPrivate::Params::reset
              (&((this->stream->ts).d_ptr._M_t.
                 super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
                 .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl)->params);
    this_00 = (this->stream->ts).d_ptr._M_t.
              super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
              _M_t.
              super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
              .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
    local_5a = 0x22;
    QTextStreamPrivate::write(this_00,(int)&local_5a,(void *)0x1,(size_t)__n);
    if (length != 0) {
      bVar3 = false;
      do {
        __fd = (int)&local_58;
        if (bVar3) {
          putByteArray((QDebug *)begin);
          if ((extraout_RAX & 1) == 0) {
            local_58.d.d._0_4_ = CONCAT22(local_5a,local_5a);
            QTextStreamPrivate::write(this_00,__fd,(void *)0x2,(size_t)__n);
          }
          bVar3 = false;
        }
        bVar1 = *(byte *)&((QDebug *)begin)->stream;
        __n = (storage_type *)(ulong)bVar1;
        if (((bVar1 - 0x20 < 0x5f) && (bVar1 != 0x22)) && (bVar1 != 0x5c)) {
          local_58.d.d = (Data *)CONCAT62(local_58.d.d._2_6_,(ushort)bVar1);
          QTextStreamPrivate::write(this_00,__fd,(void *)0x1,(size_t)__n);
        }
        else {
          local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.size = CONCAT44(local_58.d.size._4_4_,0xaaaaaaaa);
          uVar2 = bVar1 - 8;
          if (5 < uVar2) {
            if ((bVar1 != 0x5c) && (bVar1 != 0x22)) goto switchD_002238fd_caseD_b;
            local_58.d.d._0_4_ = (uint)CONCAT12(bVar1,0x5c);
            local_58.d.d = (Data *)CONCAT44(0xaaaaaaaa,(uint)local_58.d.d);
            goto LAB_00223994;
          }
          __n = (storage_type *)
                ((long)&switchD_002238fd::switchdataD_004da1d8 +
                (long)(int)(&switchD_002238fd::switchdataD_004da1d8)[uVar2]);
          switch((uint)bVar1) {
          case 8:
            local_58.d.d = (Data *)0xaaaaaaaa0062005c;
            break;
          case 9:
            local_58.d.d = (Data *)0xaaaaaaaa0074005c;
            break;
          case 10:
            local_58.d.d = (Data *)0xaaaaaaaa006e005c;
            break;
          case 0xb:
switchD_002238fd_caseD_b:
            if (content == ContainsLatin1) {
              local_58.d.d = (Data *)0x3000300075005c;
              __n = (storage_type *)(ulong)(uint)(int)"0123456789ABCDEF"[bVar1 >> 4];
              local_58.d.ptr =
                   (char16_t *)
                   CONCAT44(0xaaaaaaaa,
                            CONCAT22((short)"0123456789ABCDEF"[bVar1 & 0xf],
                                     (short)"0123456789ABCDEF"[bVar1 >> 4]));
              __buf = (void *)0x6;
            }
            else {
              __n = (storage_type *)(ulong)(uint)(int)"0123456789ABCDEF"[bVar1 >> 4];
              local_58.d.d = (Data *)CONCAT26((short)"0123456789ABCDEF"[bVar1 & 0xf],
                                              CONCAT24((short)"0123456789ABCDEF"[bVar1 >> 4],
                                                       0x78005c));
              bVar3 = true;
              __buf = (void *)0x4;
            }
            goto LAB_00223999;
          case 0xc:
            local_58.d.d = (Data *)0xaaaaaaaa0066005c;
            break;
          case 0xd:
            local_58.d.d = (Data *)0xaaaaaaaa0072005c;
          }
LAB_00223994:
          __buf = (void *)0x2;
LAB_00223999:
          QTextStreamPrivate::write(this_00,__fd,__buf,(size_t)__n);
        }
        begin = (char *)((long)&((QDebug *)begin)->stream + 1);
        length = length - 1;
      } while (length != 0);
    }
    QTextStreamPrivate::write(this_00,(int)&local_5a,(void *)0x1,(size_t)__n);
    QDebugStateSaver::~QDebugStateSaver(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDebug::putByteArray(const char *begin, size_t length, Latin1Content content)
{
    if (stream->noQuotes) {
        // no quotes, write the string directly too (no pretty-printing)
        // this respects the QTextStream state, though
        QString string = content == ContainsLatin1 ? QString::fromLatin1(begin, qsizetype(length))
                                                   : QString::fromUtf8(begin, qsizetype(length));
        stream->ts.d_ptr->putString(string);
    } else {
        // we'll reset the QTextStream formatting mechanisms, so save the state
        QDebugStateSaver saver(*this);
        stream->ts.d_ptr->params.reset();
        putEscapedString(stream->ts.d_ptr.get(), reinterpret_cast<const uchar *>(begin),
                         length, content == ContainsLatin1);
    }
}